

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool QResource::registerResource(uchar *rccData,QString *resourceRoot)

{
  bool bVar1;
  ushort *puVar2;
  QDynamicBufferResourceRoot *this;
  QString *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDynamicBufferResourceRoot *root;
  scoped_lock<QRecursiveMutex> locker;
  QString r;
  parameter_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QString *in_stack_ffffffffffffff08;
  QMessageLogger *in_stack_ffffffffffffff10;
  qsizetype in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  bool local_a9;
  bool local_71;
  QMessageLogger local_68;
  QChar local_42 [13];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QString *)in_stack_fffffffffffffef8);
  qt_resource_fixResourceRoot(in_stack_ffffffffffffff08);
  QString::~QString((QString *)0x2e90b8);
  bVar1 = QString::isEmpty((QString *)0x2e90c5);
  local_a9 = false;
  if (!bVar1) {
    QString::operator[]((QString *)in_stack_fffffffffffffef8,0x2e90e3);
    QChar::QChar<char16_t,_true>(local_42,L'/');
    local_a9 = ::operator!=((QChar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            (QChar *)in_stack_fffffffffffffef8);
  }
  if (local_a9 == false) {
    this = (QDynamicBufferResourceRoot *)operator_new(0x48);
    anon_unknown.dwarf_3b8fd3::QDynamicBufferResourceRoot::QDynamicBufferResourceRoot
              ((QDynamicBufferResourceRoot *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QString *)in_stack_fffffffffffffef8);
    bVar1 = anon_unknown.dwarf_3b8fd3::QDynamicBufferResourceRoot::registerSelf
                      (this,(uchar *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
    if (bVar1) {
      QBasicAtomicInteger<int>::ref
                ((QBasicAtomicInteger<int> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      resourceMutex();
      (anonymous_namespace)::qt_scoped_lock<QRecursiveMutex,std::scoped_lock<QRecursiveMutex>>
                ((QRecursiveMutex *)in_stack_fffffffffffffef8);
      resourceList();
      QList<(anonymous_namespace)::QResourceRoot_*>::append
                ((QList<(anonymous_namespace)::QResourceRoot_*> *)0x2e928f,in_stack_fffffffffffffef8
                );
      local_71 = true;
      std::scoped_lock<QRecursiveMutex>::~scoped_lock((scoped_lock<QRecursiveMutex> *)0x2e92ae);
    }
    else {
      if (this != (QDynamicBufferResourceRoot *)0x0) {
        (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])();
      }
      local_71 = false;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
               ,(char *)in_stack_fffffffffffffef8);
    QtPrivate::asString(in_RSI);
    puVar2 = QString::utf16((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                           );
    QMessageLogger::warning
              (&local_68,
               "QDir::registerResource: Registering a resource [%p] must be rooted in an absolute path (start with /) [%ls]"
               ,in_RDI,puVar2);
    local_71 = false;
  }
  QString::~QString((QString *)0x2e932f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return local_71;
  }
  __stack_chk_fail();
}

Assistant:

bool QResource::registerResource(const uchar *rccData, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%p] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 rccData, qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicBufferResourceRoot *root = new QDynamicBufferResourceRoot(r);
    if (root->registerSelf(rccData, -1)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}